

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall Poisson::Poisson(Poisson *this,Time *time,string *name,string *type)

{
  allocator<char> local_59;
  string local_58;
  string *local_28;
  string *type_local;
  string *name_local;
  Time *time_local;
  Poisson *this_local;
  
  local_28 = type;
  type_local = name;
  name_local = (string *)time;
  time_local = (Time *)this;
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,name,type);
  RandN::RandN((RandN *)this);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__Poisson_00190938;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__Poisson_001909d0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__Poisson_00190a18;
  this->poissonRate =
       ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
        super_TimeDependent.xTime)->dt * 5.0;
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_StochasticEventGenerator).super_StochasticVariable.
              super_StochasticProcess.stochDescription,"Poisson process");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rate",&local_59);
  Parametric::addParameter((Parametric *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

Poisson::Poisson(Time* time, const string& name, const string& type)
: StochasticEventGenerator(time, name, type)
{
	poissonRate = 5.0 * xTime->dt;
	stochDescription = "Poisson process";
	addParameter("rate");
}